

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

timestamp_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::timestamp_t,duckdb::QuantileIndirect<duckdb::timestamp_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::timestamp_t> *accessor)

{
  CURSOR *pCVar1;
  timestamp_t tVar2;
  bool bVar3;
  timestamp_t tVar4;
  bool bVar5;
  reference pvVar6;
  double dVar7;
  undefined1 auVar8 [16];
  timestamp_t result_1;
  timestamp_t local_58;
  string local_50;
  
  pCVar1 = accessor->data;
  bVar3 = (pCVar1->scan).next_row_index <= lidx;
  bVar5 = lidx < (pCVar1->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar5 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar1->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar1->scan);
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      pCVar1->data = *(timestamp_t **)(pvVar6 + 0x20);
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar1->validity = (ValidityMask *)(pvVar6 + 0x28);
    }
    tVar2.value = pCVar1->data[(uint)((int)lidx - (int)(pCVar1->scan).current_row_index)].value;
    bVar5 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (tVar2,&local_58,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)tVar2.value,(timestamp_t)auVar8._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (bVar5 || bVar3) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar1->inputs,(ColumnDataScanState *)lidx,(DataChunk *)&pCVar1->scan);
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      pCVar1->data = *(timestamp_t **)(pvVar6 + 0x20);
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar1->validity = (ValidityMask *)(pvVar6 + 0x28);
    }
    tVar2.value = pCVar1->data[(uint)((int)lidx - (int)(pCVar1->scan).current_row_index)].value;
    bVar5 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (tVar2,&local_58,false);
    tVar4.value = local_58.value;
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)tVar2.value,(timestamp_t)auVar8._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    pCVar1 = accessor->data;
    if (((pCVar1->scan).next_row_index <= hidx) || (hidx < (pCVar1->scan).current_row_index)) {
      duckdb::ColumnDataCollection::Seek
                ((ulong)pCVar1->inputs,(ColumnDataScanState *)hidx,(DataChunk *)&pCVar1->scan);
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      pCVar1->data = *(timestamp_t **)(pvVar6 + 0x20);
      pvVar6 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)&pCVar1->page,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar1->validity = (ValidityMask *)(pvVar6 + 0x28);
    }
    tVar2.value = pCVar1->data[(uint)((int)hidx - (int)(pCVar1->scan).current_row_index)].value;
    bVar5 = duckdb::TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                      (tVar2,&local_58,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_t>
                (&local_50,(duckdb *)tVar2.value,(timestamp_t)auVar8._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar7 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_58.value = llround(dVar7 * (double)local_58.value + (1.0 - dVar7) * (double)tVar4.value);
  }
  return (timestamp_t)local_58.value;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}